

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution::forward
          (Convolution *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined1 uVar1;
  bool bVar2;
  const_reference weight_data;
  const_reference bias_data;
  reference pvVar3;
  Mat *in_RCX;
  Mat *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat *in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  Mat *in_stack_00000038;
  Option *in_stack_00000040;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Mat *in_stack_fffffffffffffe50;
  Option *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6c;
  undefined1 in_stack_fffffffffffffe6d;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  Mat local_150;
  const_reference local_108;
  Option *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Mat *in_stack_ffffffffffffff50;
  Mat *in_stack_ffffffffffffff58;
  Convolution *in_stack_ffffffffffffff60;
  int local_14;
  
  weight_data = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  bias_data = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                     ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_RDX,0);
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff58);
  flatten(in_RDI,(Mat *)CONCAT17(in_stack_fffffffffffffe6f,
                                 CONCAT16(in_stack_fffffffffffffe6e,
                                          CONCAT15(in_stack_fffffffffffffe6d,
                                                   CONCAT14(in_stack_fffffffffffffe6c,
                                                            in_stack_fffffffffffffe68)))),
          in_stack_fffffffffffffe60);
  uVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  if ((bool)uVar1) {
    local_14 = -100;
    goto LAB_001a227a;
  }
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff00);
  if (in_RDI[3].dims == 0) {
LAB_001a1feb:
    ncnn::Mat::Mat(&local_150);
    make_padding(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if (bVar2) {
      local_14 = -100;
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                        in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                        CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        (Allocator *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30))
      ;
      if (bVar2) {
        local_14 = -100;
      }
      else {
        local_14 = convolution(in_RDX,in_RCX,weight_data,bias_data,(int)((ulong)pvVar3 >> 0x20),
                               (int)pvVar3,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                               in_stack_00000028,in_stack_00000030,in_stack_00000038,
                               in_stack_00000040);
        if (local_14 == 0) {
          local_14 = 0;
        }
      }
    }
    ncnn::Mat::~Mat((Mat *)0x1a225c);
  }
  else {
    local_108 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
    flatten(in_RDI,(Mat *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe6e,
                                                  CONCAT15(in_stack_fffffffffffffe6d,
                                                           CONCAT14(in_stack_fffffffffffffe6c,
                                                                    in_stack_fffffffffffffe68)))),
            in_stack_fffffffffffffe60);
    bVar2 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if (!bVar2) goto LAB_001a1feb;
    local_14 = -100;
  }
  ncnn::Mat::~Mat((Mat *)0x1a2269);
LAB_001a227a:
  ncnn::Mat::~Mat((Mat *)0x1a2287);
  return local_14;
}

Assistant:

int Convolution::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, _kernel_h, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}